

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunVmPass(ExpressionContext *ctx,VmModule *module,VmFunction *function,VmPassType type)

{
  VmPassType type_local;
  VmFunction *function_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  if (function->firstBlock != (VmBlock *)0x0) {
    switch(type) {
    case VM_PASS_OPT_PEEPHOLE:
      RunPeepholeOptimizations(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_OPT_CONSTANT_PROPAGATION:
      RunConstantPropagation(ctx,module,&function->super_VmValue,false);
      break;
    case VM_PASS_OPT_DEAD_CODE_ELIMINATION:
      RunDeadCodeElimiation(ctx,module,function);
      break;
    case VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION:
      RunControlFlowOptimization(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_OPT_LOAD_STORE_PROPAGATION:
      RunLoadStorePropagation(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION:
      RunCommonSubexpressionElimination(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION:
      RunDeadAlocaStoreElimination(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_OPT_MEMORY_TO_REGISTER:
      RunMemoryToRegister(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_OPT_ARRAY_TO_ELEMENTS:
      RunArrayToElements(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_OPT_LATE_PEEPHOLE:
      RunLatePeepholeOptimizations(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_OPT_FUNCION_INLINING:
      RunFunctionInlining(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_UPDATE_LIVE_SETS:
      RunUpdateLiveSets(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_PREPARE_SSA_EXIT:
      RunPrepareSsaExit(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_CREATE_ALLOCA_STORAGE:
      RunCreateAllocaStorage(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_LEGALIZE_ARRAY_VALUES:
      RunLegalizeArrayValues(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_LEGALIZE_BITCASTS:
      RunLegalizeBitcasts(ctx,module,&function->super_VmValue);
      break;
    case VM_PASS_LEGALIZE_EXTRACTS:
      RunLegalizeExtracts(ctx,module,&function->super_VmValue);
    }
    VmFunction::MoveEntryBlockToStart(function);
  }
  return;
}

Assistant:

void RunVmPass(ExpressionContext &ctx, VmModule *module, VmFunction *function, VmPassType type)
{
	if(!function->firstBlock)
		return;

	switch(type)
	{
	case VM_PASS_OPT_PEEPHOLE:
		RunPeepholeOptimizations(ctx, module, function);
		break;
	case VM_PASS_OPT_CONSTANT_PROPAGATION:
		RunConstantPropagation(ctx, module, function, false);
		break;
	case VM_PASS_OPT_DEAD_CODE_ELIMINATION:
		RunDeadCodeElimiation(ctx, module, function);
		break;
	case VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION:
		RunControlFlowOptimization(ctx, module, function);
		break;
	case VM_PASS_OPT_LOAD_STORE_PROPAGATION:
		RunLoadStorePropagation(ctx, module, function);
		break;
	case VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION:
		RunCommonSubexpressionElimination(ctx, module, function);
		break;
	case VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION:
		RunDeadAlocaStoreElimination(ctx, module, function);
		break;
	case VM_PASS_OPT_MEMORY_TO_REGISTER:
		RunMemoryToRegister(ctx, module, function);
		break;
	case VM_PASS_OPT_ARRAY_TO_ELEMENTS:
		RunArrayToElements(ctx, module, function);
		break;
	case VM_PASS_OPT_LATE_PEEPHOLE:
		RunLatePeepholeOptimizations(ctx, module, function);
		break;
	case VM_PASS_OPT_FUNCION_INLINING:
		RunFunctionInlining(ctx, module, function);
		break;
	case VM_PASS_UPDATE_LIVE_SETS:
		RunUpdateLiveSets(ctx, module, function);
		break;
	case VM_PASS_PREPARE_SSA_EXIT:
		RunPrepareSsaExit(ctx, module, function);
		break;
	case VM_PASS_CREATE_ALLOCA_STORAGE:
		RunCreateAllocaStorage(ctx, module, function);
		break;
	case VM_PASS_LEGALIZE_ARRAY_VALUES:
		RunLegalizeArrayValues(ctx, module, function);
		break;
	case VM_PASS_LEGALIZE_BITCASTS:
		RunLegalizeBitcasts(ctx, module, function);
		break;
	case VM_PASS_LEGALIZE_EXTRACTS:
		RunLegalizeExtracts(ctx, module, function);
		break;
	}

	// Preserve entry block order for execution
	function->MoveEntryBlockToStart();
}